

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Publications.cpp
# Opt level: O1

void __thiscall helics::Publication::publishInt(Publication *this,int64_t val)

{
  ValueFederate *pVVar1;
  bool bVar2;
  SmallBuffer db;
  int64_t local_a0;
  data_view local_98;
  SmallBuffer local_78;
  
  pVVar1 = this->fed;
  local_a0 = val;
  if (this->changeDetectionEnabled == true) {
    bVar2 = changeDetected(&this->prevValue,val,this->delta);
    if (!bVar2) {
      return;
    }
    std::
    variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
    ::operator=((variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                 *)&this->prevValue,&local_a0);
  }
  if (pVVar1 != (ValueFederate *)0x0) {
    typeConvert(&local_78,this->pubType,local_a0);
    local_98.dblock._M_len = local_78.bufferSize;
    local_98.dblock._M_str = (char *)local_78.heap;
    local_98.ref.super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_98.ref.super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    helics::ValueFederate::publishBytes(this->fed,this,&local_98);
    if (local_98.ref.super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_98.ref.
                 super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (((local_78.usingAllocatedBuffer == true) && (local_78.nonOwning == false)) &&
       (local_78.heap != (byte *)0x0)) {
      operator_delete__(local_78.heap);
    }
  }
  return;
}

Assistant:

void Publication::publishInt(int64_t val)
{
    bool doPublish = (fed != nullptr);
    if (changeDetectionEnabled) {
        if (changeDetected(prevValue, val, delta)) {
            prevValue = val;
        } else {
            doPublish = false;
        }
    }
    if (doPublish) {
        auto db = typeConvert(pubType, val);
        fed->publishBytes(*this, db);
    }
}